

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestSuite_Internals.cpp
# Opt level: O2

void __thiscall
psy::C::InternalsTestSuite::parse
          (InternalsTestSuite *this,string source,Expectation X,SyntaxCategory syntaxCat,
          ParseOptions parseOpts)

{
  unique_ptr<psy::C::SyntaxTree,_std::default_delete<psy::C::SyntaxTree>_> *this_00;
  string *__rhs;
  size_type sVar1;
  pointer pSVar2;
  ParseOptions parseOptions;
  _Alloc_hider _Var3;
  undefined8 uVar4;
  pointer __p;
  bool bVar5;
  __type _Var6;
  ostream *poVar7;
  undefined8 uVar8;
  SyntaxNode *pSVar9;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var10;
  ostream *this_01;
  Expectation *in_RDX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  int iVar11;
  undefined7 in_register_00000031;
  iterator __end1;
  iterator __begin1;
  pointer pSVar12;
  string names;
  string textP;
  string text;
  string namesP;
  Unparser unparser;
  SyntaxNamePrinter printer;
  string local_410 [32];
  SourceText local_3f0;
  ostringstream ossTree;
  Expectation local_258;
  ostringstream ossText;
  
  std::__cxx11::string::string((string *)&text,(string *)CONCAT71(in_register_00000031,syntaxCat));
  if (in_RDX->containsAmbiguity_ == true) {
    ParseOptions::setAmbiguityMode((ParseOptions *)&source,Diagnose);
  }
  std::__cxx11::string::string(local_410,(string *)&text);
  psy::SourceText::SourceText(&local_3f0,local_410);
  uVar4 = source.field_2._8_8_;
  uVar8 = source.field_2._M_allocated_capacity;
  sVar1 = source._M_string_length;
  _Var3 = source._M_dataplus;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&ossTree,"",(allocator<char> *)&printer);
  parseOptions.langExts_.translations_.field_0 =
       (anon_union_8_2_2d0bec1f_for_MacroTranslations_0)sVar1;
  parseOptions._0_8_ = _Var3._M_p;
  parseOptions.langExts_.field_1 = (anon_union_8_2_2d0bec1f_for_LanguageExtensions_1)uVar8;
  parseOptions._24_8_ = uVar4;
  SyntaxTree::parseText
            ((SourceText *)&ossText,(TextPreprocessingState)&local_3f0,Unknown,parseOptions,
             (string *)0x2,(SyntaxCategory)&ossTree);
  __p = _ossText;
  this_00 = &this->tree_;
  _ossText = (pointer)0x0;
  std::__uniq_ptr_impl<psy::C::SyntaxTree,_std::default_delete<psy::C::SyntaxTree>_>::reset
            ((__uniq_ptr_impl<psy::C::SyntaxTree,_std::default_delete<psy::C::SyntaxTree>_> *)
             this_00,__p);
  std::unique_ptr<psy::C::SyntaxTree,_std::default_delete<psy::C::SyntaxTree>_>::~unique_ptr
            ((unique_ptr<psy::C::SyntaxTree,_std::default_delete<psy::C::SyntaxTree>_> *)&ossText);
  std::__cxx11::string::~string((string *)&ossTree);
  std::__cxx11::string::~string((string *)&local_3f0);
  std::__cxx11::string::~string(local_410);
  if ((in_RDX->numE_ == 0) && (in_RDX->numW_ == 0)) {
    bVar5 = SyntaxTree::parseExitedEarly
                      ((this_00->_M_t).
                       super___uniq_ptr_impl<psy::C::SyntaxTree,_std::default_delete<psy::C::SyntaxTree>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_psy::C::SyntaxTree_*,_std::default_delete<psy::C::SyntaxTree>_>
                       .super__Head_base<0UL,_psy::C::SyntaxTree_*,_false>._M_head_impl);
    if (bVar5) {
      if (in_RDX->unfinishedParse_ == false) {
        poVar7 = std::operator<<((ostream *)&std::cout,"\n!\tFAIL\n");
        poVar7 = std::operator<<(poVar7,"\t\tExpression is NOT ");
        poVar7 = std::operator<<(poVar7,"true");
        poVar7 = std::operator<<(poVar7,"\n");
        poVar7 = std::operator<<(poVar7,"\t\t");
        poVar7 = std::operator<<(poVar7,
                                 "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/tests/TestSuite_Internals.cpp"
                                );
        poVar7 = std::operator<<(poVar7,":");
        poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,0xe4);
        std::endl<char,std::char_traits<char>>(poVar7);
        uVar8 = __cxa_allocate_exception(1);
        __cxa_throw(uVar8,&TestFailed::typeinfo,0);
      }
      goto LAB_00399d05;
    }
  }
  Expectation::Expectation(&local_258,in_RDX);
  bVar5 = checkErrorAndWarn(this,&local_258);
  Expectation::~Expectation(&local_258);
  if (!bVar5) goto LAB_00399d05;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&ossTree);
  SyntaxNamePrinter::SyntaxDumper
            (&printer,(this_00->_M_t).
                      super___uniq_ptr_impl<psy::C::SyntaxTree,_std::default_delete<psy::C::SyntaxTree>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_psy::C::SyntaxTree_*,_std::default_delete<psy::C::SyntaxTree>_>
                      .super__Head_base<0UL,_psy::C::SyntaxTree_*,_false>._M_head_impl);
  pSVar9 = SyntaxTree::root((this_00->_M_t).
                            super___uniq_ptr_impl<psy::C::SyntaxTree,_std::default_delete<psy::C::SyntaxTree>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_psy::C::SyntaxTree_*,_std::default_delete<psy::C::SyntaxTree>_>
                            .super__Head_base<0UL,_psy::C::SyntaxTree_*,_false>._M_head_impl);
  SyntaxNamePrinter::print(&printer,pSVar9,Plain,(ostream *)&ossTree);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&ossText);
  Unparser::SyntaxDumper
            (&unparser,
             (this_00->_M_t).
             super___uniq_ptr_impl<psy::C::SyntaxTree,_std::default_delete<psy::C::SyntaxTree>_>.
             _M_t.
             super__Tuple_impl<0UL,_psy::C::SyntaxTree_*,_std::default_delete<psy::C::SyntaxTree>_>.
             super__Head_base<0UL,_psy::C::SyntaxTree_*,_false>._M_head_impl);
  pSVar9 = SyntaxTree::root((this_00->_M_t).
                            super___uniq_ptr_impl<psy::C::SyntaxTree,_std::default_delete<psy::C::SyntaxTree>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_psy::C::SyntaxTree_*,_std::default_delete<psy::C::SyntaxTree>_>
                            .super__Head_base<0UL,_psy::C::SyntaxTree_*,_false>._M_head_impl);
  Unparser::unparse(&unparser,pSVar9,(ostream *)&ossText);
  std::__cxx11::stringbuf::str();
  _Var10 = std::
           __remove_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_pred<int(*)(int)noexcept>>
                     ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       )textP._M_dataplus._M_p,
                      (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       )(textP._M_dataplus._M_p + textP._M_string_length),
                      (_Iter_pred<int_(*)(int)_noexcept>)isspace);
  std::__cxx11::string::erase
            (&textP,_Var10._M_current,textP._M_dataplus._M_p + textP._M_string_length);
  _Var10 = std::
           __remove_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_pred<int(*)(int)noexcept>>
                     ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       )text._M_dataplus._M_p,
                      (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       )(text._M_dataplus._M_p + text._M_string_length),
                      (_Iter_pred<int_(*)(int)_noexcept>)isspace);
  std::__cxx11::string::erase(&text,_Var10._M_current,text._M_dataplus._M_p + text._M_string_length)
  ;
  if (in_RDX->containsAmbiguity_ == true) {
    sVar1 = (in_RDX->ambiguityText_)._M_string_length;
    if (sVar1 == 0) {
      std::operator+(&names,&text,&text);
      _Var6 = std::operator==(&textP,&names);
      std::__cxx11::string::~string((string *)&names);
      uVar8 = extraout_RDX_01;
      if (!_Var6) {
        poVar7 = std::operator<<((ostream *)&std::cout,"\n!\tFAIL\n");
        poVar7 = std::operator<<(poVar7,"\t\tActual  : ");
        poVar7 = std::operator<<(poVar7,(string *)&textP);
        poVar7 = std::operator<<(poVar7,"\n");
        poVar7 = std::operator<<(poVar7,"\t\tExpected: ");
        std::operator+(&names,&text,&text);
        poVar7 = std::operator<<(poVar7,(string *)&names);
        poVar7 = std::operator<<(poVar7,"\n");
        poVar7 = std::operator<<(poVar7,"\t\t");
        poVar7 = std::operator<<(poVar7,
                                 "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/tests/TestSuite_Internals.cpp"
                                );
        poVar7 = std::operator<<(poVar7,":");
        poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,0x104);
        std::endl<char,std::char_traits<char>>(poVar7);
        std::__cxx11::string::~string((string *)&names);
        goto LAB_00399ba6;
      }
    }
    else {
      __rhs = &in_RDX->ambiguityText_;
      _Var10._M_current = (__rhs->_M_dataplus)._M_p;
      _Var10 = std::
               __remove_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_pred<int(*)(int)noexcept>>
                         (_Var10,_Var10._M_current + sVar1,
                          (_Iter_pred<int_(*)(int)_noexcept>)isspace);
      std::__cxx11::string::erase
                (__rhs,_Var10._M_current,
                 (in_RDX->ambiguityText_)._M_dataplus._M_p +
                 (in_RDX->ambiguityText_)._M_string_length);
      _Var6 = std::operator==(&textP,__rhs);
      uVar8 = extraout_RDX;
      if (!_Var6) {
        poVar7 = std::operator<<((ostream *)&std::cout,"\n!\tFAIL\n");
        poVar7 = std::operator<<(poVar7,"\t\tActual  : ");
        poVar7 = std::operator<<(poVar7,(string *)&textP);
        poVar7 = std::operator<<(poVar7,"\n");
        poVar7 = std::operator<<(poVar7,"\t\tExpected: ");
        poVar7 = std::operator<<(poVar7,(string *)__rhs);
        poVar7 = std::operator<<(poVar7,"\n");
        poVar7 = std::operator<<(poVar7,"\t\t");
        poVar7 = std::operator<<(poVar7,
                                 "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/tests/TestSuite_Internals.cpp"
                                );
        this_01 = (ostream *)std::operator<<(poVar7,":");
        iVar11 = 0x10a;
        goto LAB_00399b96;
      }
    }
  }
  else {
    _Var6 = std::operator==(&textP,&text);
    uVar8 = extraout_RDX_00;
    if (!_Var6) {
      poVar7 = std::operator<<((ostream *)&std::cout,"\n!\tFAIL\n");
      poVar7 = std::operator<<(poVar7,"\t\tActual  : ");
      poVar7 = std::operator<<(poVar7,(string *)&textP);
      poVar7 = std::operator<<(poVar7,"\n");
      poVar7 = std::operator<<(poVar7,"\t\tExpected: ");
      poVar7 = std::operator<<(poVar7,(string *)&text);
      poVar7 = std::operator<<(poVar7,"\n");
      poVar7 = std::operator<<(poVar7,"\t\t");
      poVar7 = std::operator<<(poVar7,
                               "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/tests/TestSuite_Internals.cpp"
                              );
      this_01 = (ostream *)std::operator<<(poVar7,":");
      iVar11 = 0x10e;
LAB_00399b96:
      poVar7 = (ostream *)std::ostream::operator<<(this_01,iVar11);
      std::endl<char,std::char_traits<char>>(poVar7);
LAB_00399ba6:
      uVar8 = __cxa_allocate_exception(1);
      __cxa_throw(uVar8,&TestFailed::typeinfo,0);
    }
  }
  pSVar12 = (in_RDX->syntaxKinds_).
            super__Vector_base<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_>._M_impl.
            super__Vector_impl_data._M_start;
  pSVar2 = (in_RDX->syntaxKinds_).
           super__Vector_base<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pSVar12 != pSVar2) {
    names._M_dataplus._M_p = (pointer)&names.field_2;
    names._M_string_length = 0;
    names.field_2._M_local_buf[0] = '\0';
    for (; pSVar12 != pSVar2; pSVar12 = pSVar12 + 1) {
      to_string_abi_cxx11_(&namesP,(C *)(ulong)*pSVar12,(SyntaxKind)uVar8);
      std::__cxx11::string::append((string *)&names);
      std::__cxx11::string::~string((string *)&namesP);
      uVar8 = extraout_RDX_02;
    }
    std::__cxx11::stringbuf::str();
    _Var10 = std::
             __remove_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_pred<int(*)(int)noexcept>>
                       ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         )namesP._M_dataplus._M_p,
                        (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         )(namesP._M_dataplus._M_p + namesP._M_string_length),
                        (_Iter_pred<int_(*)(int)_noexcept>)isspace);
    std::__cxx11::string::erase
              (&namesP,_Var10._M_current,namesP._M_dataplus._M_p + namesP._M_string_length);
    _Var6 = std::operator==(&namesP,&names);
    if (!_Var6) {
      poVar7 = std::operator<<((ostream *)&std::cout,"\n!\tFAIL\n");
      poVar7 = std::operator<<(poVar7,"\t\tActual  : ");
      poVar7 = std::operator<<(poVar7,(string *)&namesP);
      poVar7 = std::operator<<(poVar7,"\n");
      poVar7 = std::operator<<(poVar7,"\t\tExpected: ");
      poVar7 = std::operator<<(poVar7,(string *)&names);
      poVar7 = std::operator<<(poVar7,"\n");
      poVar7 = std::operator<<(poVar7,"\t\t");
      poVar7 = std::operator<<(poVar7,
                               "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/tests/TestSuite_Internals.cpp"
                              );
      poVar7 = std::operator<<(poVar7,":");
      poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,0x119);
      std::endl<char,std::char_traits<char>>(poVar7);
      uVar8 = __cxa_allocate_exception(1);
      __cxa_throw(uVar8,&TestFailed::typeinfo,0);
    }
    std::__cxx11::string::~string((string *)&namesP);
    std::__cxx11::string::~string((string *)&names);
  }
  std::__cxx11::string::~string((string *)&textP);
  SyntaxVisitor::~SyntaxVisitor((SyntaxVisitor *)&unparser);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ossText);
  SyntaxNamePrinter::~SyntaxNamePrinter(&printer);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ossTree);
LAB_00399d05:
  std::__cxx11::string::~string((string *)&text);
  return;
}

Assistant:

void InternalsTestSuite::parse(std::string source,
                               Expectation X,
                               SyntaxTree::SyntaxCategory syntaxCat,
                               ParseOptions parseOpts)
{
    auto text = source;

#ifdef DBG_DIAGNOSTICS
    if (X.numW_ > 0 || X.numE_ > 0) {
        std::cout << std::endl;
        if (X.numW_ > 0)
            std::cout << "\t\t[expect (parser) WARNING]\n";
        if (X.numE_ > 0)
            std::cout << "\t\t[expect (parser) ERROR]\n";
    }
#endif

    if (X.containsAmbiguity_)
        parseOpts.setAmbiguityMode(ParseOptions::AmbiguityMode::Diagnose);

    tree_ = SyntaxTree::parseText(text,
                                  TextPreprocessingState::Unknown,
                                  TextCompleteness::Fragment,
                                  parseOpts,
                                  "",
                                  syntaxCat);

    if (X.numE_ == 0 && X.numW_ == 0 && tree_->parseExitedEarly()) {
        PSY_EXPECT_TRUE(X.unfinishedParse_);
        return;
    }

    if (!checkErrorAndWarn(X))
        return;

    std::ostringstream ossTree;
    SyntaxNamePrinter printer(tree_.get());
    printer.print(tree_->root(),
                  SyntaxNamePrinter::Style::Plain,
                  ossTree);

#ifdef DUMP_AST
    std::cout << "\n\n"
              << "========================== AST ==================================\n"
              << source << "\n"
              << "-----------------------------------------------------------------"
              << ossTree.str()
              << "=================================================================\n";
#endif

    std::ostringstream ossText;
    Unparser unparser(tree_.get());
    unparser.unparse(tree_->root(), ossText);

    std::string textP = ossText.str();
    textP.erase(std::remove_if(textP.begin(), textP.end(), ::isspace), textP.end());
    text.erase(std::remove_if(text.begin(), text.end(), ::isspace), text.end());

    if (X.containsAmbiguity_) {
        if (X.ambiguityText_.empty())
            PSY_EXPECT_EQ_STR(textP, text + text);
        else {
            X.ambiguityText_.erase(
                        std::remove_if(X.ambiguityText_.begin(),
                                       X.ambiguityText_.end(), ::isspace),
                        X.ambiguityText_.end());
            PSY_EXPECT_EQ_STR(textP, X.ambiguityText_);
        }
    }
    else
        PSY_EXPECT_EQ_STR(textP, text);

    if (X.syntaxKinds_.empty())
        return;

    std::string names;
    for (auto k : X.syntaxKinds_)
        names += to_string(k);

    std::string namesP = ossTree.str();
    namesP.erase(std::remove_if(namesP.begin(), namesP.end(), ::isspace), namesP.end());
    PSY_EXPECT_EQ_STR(namesP, names);
}